

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinc_resampler.cc
# Opt level: O0

void __thiscall
webrtc::SincResampler::Resample(SincResampler *this,size_t frames,float *destination)

{
  double dVar1;
  size_t sVar2;
  int iVar3;
  pointer pfVar4;
  float *k1_00;
  float fVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double kernel_interpolation_factor;
  float *input_ptr;
  float *k2;
  float *k1;
  int offset_idx;
  double virtual_offset_idx;
  double subsample_remainder;
  int source_idx;
  int i;
  float *kernel_ptr;
  double current_io_ratio;
  size_t remaining_frames;
  float *destination_local;
  size_t frames_local;
  SincResampler *this_local;
  
  if (((this->buffer_primed_ & 1U) == 0) && (frames != 0)) {
    (*this->read_cb_->_vptr_SincResamplerCallback[2])
              (this->read_cb_,this->request_frames_,this->r0_);
    this->buffer_primed_ = true;
  }
  dVar1 = this->io_sample_rate_ratio_;
  pfVar4 = std::unique_ptr<float[],_webrtc::AlignedFreeDeleter>::get(&this->kernel_storage_);
  current_io_ratio = (double)frames;
  remaining_frames = (size_t)destination;
  do {
    if (current_io_ratio == 0.0) {
      return;
    }
    sVar2 = this->block_size_;
    auVar7._8_4_ = (int)(sVar2 >> 0x20);
    auVar7._0_8_ = sVar2;
    auVar7._12_4_ = 0x45300000;
    dVar6 = ceil((((auVar7._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) -
                 this->virtual_source_idx_) / dVar1);
    for (subsample_remainder._4_4_ = (int)dVar6; 0 < subsample_remainder._4_4_;
        subsample_remainder._4_4_ = subsample_remainder._4_4_ + -1) {
      sVar2 = this->block_size_;
      auVar8._8_4_ = (int)(sVar2 >> 0x20);
      auVar8._0_8_ = sVar2;
      auVar8._12_4_ = 0x45300000;
      if ((auVar8._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0) <=
          this->virtual_source_idx_) {
        __assert_fail("virtual_source_idx_ < block_size_",
                      "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/resampler/sinc_resampler.cc"
                      ,0x124,"void webrtc::SincResampler::Resample(size_t, float *)");
      }
      dVar6 = (this->virtual_source_idx_ - (double)(int)this->virtual_source_idx_) * 32.0;
      iVar3 = (int)dVar6;
      k1_00 = pfVar4 + (long)iVar3 * 0x20;
      if (((ulong)k1_00 & 0xf) != 0) {
        __assert_fail("0u == (reinterpret_cast<uintptr_t>(k1) & 0x0F)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/resampler/sinc_resampler.cc"
                      ,0x136,"void webrtc::SincResampler::Resample(size_t, float *)");
      }
      if (((ulong)(k1_00 + 0x20) & 0xf) != 0) {
        __assert_fail("0u == (reinterpret_cast<uintptr_t>(k2) & 0x0F)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/resampler/sinc_resampler.cc"
                      ,0x137,"void webrtc::SincResampler::Resample(size_t, float *)");
      }
      fVar5 = Convolve_SSE(this->r1_ + (int)this->virtual_source_idx_,k1_00,k1_00 + 0x20,
                           dVar6 - (double)iVar3);
      *(float *)remaining_frames = fVar5;
      this->virtual_source_idx_ = dVar1 + this->virtual_source_idx_;
      current_io_ratio = (double)((long)current_io_ratio + -1);
      if (current_io_ratio == 0.0) {
        return;
      }
      remaining_frames = remaining_frames + 4;
    }
    sVar2 = this->block_size_;
    auVar9._8_4_ = (int)(sVar2 >> 0x20);
    auVar9._0_8_ = sVar2;
    auVar9._12_4_ = 0x45300000;
    this->virtual_source_idx_ =
         this->virtual_source_idx_ -
         ((auVar9._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
    memcpy(this->r1_,this->r3_,0x80);
    if (this->r0_ == this->r2_) {
      UpdateRegions(this,true);
    }
    (*this->read_cb_->_vptr_SincResamplerCallback[2])
              (this->read_cb_,this->request_frames_,this->r0_);
  } while( true );
}

Assistant:

void SincResampler::Resample(size_t frames, float* destination) {
  size_t remaining_frames = frames;

  // Step (1) -- Prime the input buffer at the start of the input stream.
  if (!buffer_primed_ && remaining_frames) {
    read_cb_->Run(request_frames_, r0_);
    buffer_primed_ = true;
  }

  // Step (2) -- Resample!  const what we can outside of the loop for speed.  It
  // actually has an impact on ARM performance.  See inner loop comment below.
  const double current_io_ratio = io_sample_rate_ratio_;
  const float* const kernel_ptr = kernel_storage_.get();
  while (remaining_frames) {
    // |i| may be negative if the last Resample() call ended on an iteration
    // that put |virtual_source_idx_| over the limit.
    //
    // Note: The loop construct here can severely impact performance on ARM
    // or when built with clang.  See https://codereview.chromium.org/18566009/
    for (int i = static_cast<int>(
             ceil((block_size_ - virtual_source_idx_) / current_io_ratio));
         i > 0; --i) {
      assert(virtual_source_idx_ < block_size_);

      // |virtual_source_idx_| lies in between two kernel offsets so figure out
      // what they are.
      const int source_idx = static_cast<int>(virtual_source_idx_);
      const double subsample_remainder = virtual_source_idx_ - source_idx;

      const double virtual_offset_idx =
          subsample_remainder * kKernelOffsetCount;
      const int offset_idx = static_cast<int>(virtual_offset_idx);

      // We'll compute "convolutions" for the two kernels which straddle
      // |virtual_source_idx_|.
      const float* const k1 = kernel_ptr + offset_idx * kKernelSize;
      const float* const k2 = k1 + kKernelSize;

      // Ensure |k1|, |k2| are 16-byte aligned for SIMD usage.  Should always be
      // true so long as kKernelSize is a multiple of 16.
      assert(0u == (reinterpret_cast<uintptr_t>(k1) & 0x0F));
      assert(0u == (reinterpret_cast<uintptr_t>(k2) & 0x0F));

      // Initialize input pointer based on quantized |virtual_source_idx_|.
      const float* const input_ptr = r1_ + source_idx;

      // Figure out how much to weight each kernel's "convolution".
      const double kernel_interpolation_factor =
          virtual_offset_idx - offset_idx;
      *destination++ = CONVOLVE_FUNC(
          input_ptr, k1, k2, kernel_interpolation_factor);

      // Advance the virtual index.
      virtual_source_idx_ += current_io_ratio;

      if (!--remaining_frames)
        return;
    }

    // Wrap back around to the start.
    virtual_source_idx_ -= block_size_;

    // Step (3) -- Copy r3_, r4_ to r1_, r2_.
    // This wraps the last input frames back to the start of the buffer.
    memcpy(r1_, r3_, sizeof(*input_buffer_.get()) * kKernelSize);

    // Step (4) -- Reinitialize regions if necessary.
    if (r0_ == r2_)
      UpdateRegions(true);

    // Step (5) -- Refresh the buffer with more input.
    read_cb_->Run(request_frames_, r0_);
  }
}